

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

DescriptorNames __thiscall
google::protobuf::DescriptorBuilder::AllocateNameStrings
          (DescriptorBuilder *this,string_view scope,string_view proto_name,Message *entity,
          FlatAllocator *alloc)

{
  _Storage<google::protobuf::internal::DescriptorNames,_true> _Var1;
  size_t sVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  optional<google::protobuf::internal::DescriptorNames> oVar5;
  string_view element_name;
  string_view name;
  string local_e0;
  size_t local_c0;
  char *local_b8;
  AlphaNum local_90;
  AlphaNum local_60;
  
  sVar3 = scope._M_len;
  oVar5 = anon_unknown_24::
          FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          ::AllocateEntityNames
                    (&alloc->
                      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                     ,scope,proto_name);
  _Var1 = oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
          _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
          _M_payload;
  if (((undefined1  [16])
       oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> &
      (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    sVar2 = proto_name._M_len;
    _Var4._M_p = proto_name._M_str;
    if (sVar3 != 0) {
      local_c0 = sVar3;
      local_b8 = scope._M_str;
      local_60.piece_ = absl::lts_20250127::NullSafeStringView(".");
      local_90.piece_._M_len = proto_name._M_len;
      local_90.piece_._M_str = proto_name._M_str;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_e0,(lts_20250127 *)&local_c0,&local_60,&local_90,&local_60);
      sVar2 = local_e0._M_string_length;
      _Var4._M_p = local_e0._M_dataplus._M_p;
    }
    element_name._M_str = _Var4._M_p;
    element_name._M_len = sVar2;
    AddError(this,element_name,entity,NAME,"Name too long.");
    if (sVar3 != 0) {
      std::__cxx11::string::~string((string *)&local_e0);
    }
    name._M_str = "unknown";
    name._M_len = 7;
    oVar5 = anon_unknown_24::
            FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ::AllocateEntityNames
                      (&alloc->
                        super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                       ,(string_view)(ZEXT816(0x34a06c) << 0x40),name);
    _Var1 = oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
            _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
            _M_payload;
    if (((undefined1  [16])
         oVar5.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
         _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames> &
        (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      std::__throw_bad_optional_access();
    }
  }
  return (DescriptorNames)_Var1;
}

Assistant:

auto DescriptorBuilder::AllocateNameStrings(const absl::string_view scope,
                                            const absl::string_view proto_name,
                                            const Message& entity,
                                            internal::FlatAllocator& alloc) {
  if (auto names = alloc.AllocateEntityNames(scope, proto_name)) {
    return *names;
  }

  AddError(scope.empty() ? proto_name : absl::StrCat(scope, ".", proto_name),
           entity, DescriptorPool::ErrorCollector::NAME, "Name too long.");
  // Return any valid name for the caller to use and keep going.
  return alloc.AllocateEntityNames("", "unknown").value();
}